

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O0

void AdjustPusher(int tag,int magnitude,int angle,bool wind)

{
  EPusher type_00;
  uint uVar1;
  FThinkerCollection *pFVar2;
  DPusher *this;
  ulong index;
  uint local_80;
  uint i;
  FSectorTagIterator itr;
  int secnum;
  size_t numcollected;
  FThinkerCollection collect;
  undefined1 local_48 [8];
  TThinkerIterator<DPusher> iterator;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  EPusher type;
  bool wind_local;
  int angle_local;
  int magnitude_local;
  int tag_local;
  
  type_00 = wind & p_pull ^ p_current;
  TArray<FThinkerCollection,_FThinkerCollection>::TArray
            ((TArray<FThinkerCollection,_FThinkerCollection> *)
             &iterator.super_FThinkerIterator.m_Stat);
  TThinkerIterator<DPusher>::TThinkerIterator((TThinkerIterator<DPusher> *)local_48,0x80);
  while (collect._0_8_ = TThinkerIterator<DPusher>::Next((TThinkerIterator<DPusher> *)local_48),
        (DPusher *)collect._0_8_ != (DPusher *)0x0) {
    numcollected._0_4_ = DPusher::CheckForSectorMatch((DPusher *)collect._0_8_,type_00,tag);
    if (-1 < (int)numcollected) {
      DPusher::ChangeValues((DPusher *)collect._0_8_,magnitude,angle);
      TArray<FThinkerCollection,_FThinkerCollection>::Push
                ((TArray<FThinkerCollection,_FThinkerCollection> *)
                 &iterator.super_FThinkerIterator.m_Stat,(FThinkerCollection *)&numcollected);
    }
  }
  uVar1 = TArray<FThinkerCollection,_FThinkerCollection>::Size
                    ((TArray<FThinkerCollection,_FThinkerCollection> *)
                     &iterator.super_FThinkerIterator.m_Stat);
  register0x00000000 = (ulong)uVar1;
  index = (ulong)(uint)tag;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffff84,tag);
  do {
    itr.searchtag = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffff84);
    if (itr.searchtag < 0) {
      TArray<FThinkerCollection,_FThinkerCollection>::~TArray
                ((TArray<FThinkerCollection,_FThinkerCollection> *)
                 &iterator.super_FThinkerIterator.m_Stat);
      return;
    }
    for (local_80 = 0; local_80 < stack0xffffffffffffff90; local_80 = local_80 + 1) {
      index = (ulong)local_80;
      pFVar2 = TArray<FThinkerCollection,_FThinkerCollection>::operator[]
                         ((TArray<FThinkerCollection,_FThinkerCollection> *)
                          &iterator.super_FThinkerIterator.m_Stat,index);
      if (pFVar2->RefNum == sectors[itr.searchtag].sectornum) break;
    }
    if (local_80 == stack0xffffffffffffff90) {
      this = (DPusher *)DObject::operator_new((DObject *)0x70,index);
      index = (ulong)type_00;
      DPusher::DPusher(this,type_00,(line_t *)0x0,magnitude,angle,(AActor *)0x0,itr.searchtag);
    }
  } while( true );
}

Assistant:

void AdjustPusher (int tag, int magnitude, int angle, bool wind)
{
	DPusher::EPusher type = wind? DPusher::p_wind : DPusher::p_current;
	
	// Find pushers already attached to the sector, and change their parameters.
	TArray<FThinkerCollection> Collection;
	{
		TThinkerIterator<DPusher> iterator;
		FThinkerCollection collect;

		while ( (collect.Obj = iterator.Next ()) )
		{
			if ((collect.RefNum = ((DPusher *)collect.Obj)->CheckForSectorMatch (type, tag)) >= 0)
			{
				((DPusher *)collect.Obj)->ChangeValues (magnitude, angle);
				Collection.Push (collect);
			}
		}
	}

	size_t numcollected = Collection.Size ();
	int secnum;

	// Now create pushers for any sectors that don't already have them.
	FSectorTagIterator itr(tag);
	while ((secnum = itr.Next()) >= 0)
	{
		unsigned int i;
		for (i = 0; i < numcollected; i++)
		{
			if (Collection[i].RefNum == sectors[secnum].sectornum)
				break;
		}
		if (i == numcollected)
		{
			new DPusher (type, NULL, magnitude, angle, NULL, secnum);
		}
	}
}